

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O0

void * __thiscall ImportedFuncWrapper::getValuePtr(ImportedFuncWrapper *this,FieldID fId)

{
  Executable *pEVar1;
  int iVar2;
  bufsize_t bVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *thunkPtr;
  offset_t thunkAddr;
  offset_t offset;
  bufsize_t thunkValSize;
  uint64_t thunkRva;
  bool isOk;
  bool is64;
  ImportedFuncWrapper *pIStack_18;
  FieldID fId_local;
  ImportedFuncWrapper *this_local;
  
  if ((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode ==
      (ExeNodeWrapper *)0x0) {
    this_local = (ImportedFuncWrapper *)0x0;
  }
  else {
    thunkRva._4_4_ = fId;
    pIStack_18 = this;
    thunkRva._3_1_ = ExeElementWrapper::isBit64((ExeElementWrapper *)this);
    thunkValSize = ExeElementWrapper::getNumValue
                             (&((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.
                                super_ExeNodeWrapper.parentNode)->super_ExeElementWrapper,
                              (long)thunkRva._4_4_,(bool *)((long)&thunkRva + 2));
    if ((thunkRva._2_1_ & 1) == 0) {
      this_local = (ImportedFuncWrapper *)0x0;
    }
    else {
      if ((thunkRva._3_1_ & 1) == 0) {
        thunkValSize = (bufsize_t)(int)thunkValSize;
      }
      if ((thunkValSize == 0) || (thunkValSize == 0xffffffffffffffff)) {
        this_local = (ImportedFuncWrapper *)0x0;
      }
      else {
        bVar3 = ImportBaseFuncWrapper::getThunkValSize(&this->super_ImportBaseFuncWrapper);
        pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                 super_ExeElementWrapper.m_Exe;
        iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])
                          (pEVar1,thunkValSize +
                                  (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.
                                  super_ExeNodeWrapper.entryNum * bVar3,2,0);
        pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                 super_ExeElementWrapper.m_Exe;
        iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                          (pEVar1,CONCAT44(extraout_var,iVar2),bVar3,0);
        this_local = (ImportedFuncWrapper *)CONCAT44(extraout_var_00,iVar2);
      }
    }
  }
  return this_local;
}

Assistant:

void* ImportedFuncWrapper::getValuePtr(ImportEntryWrapper::FieldID fId)
{
    if (!parentNode) return NULL;
    bool is64 = isBit64();

    bool isOk;
    uint64_t thunkRva = parentNode->getNumValue(fId, &isOk);
    if (!isOk) {
        //printf("Failed getting value!\n");
        return NULL;
    }
    if (!is64) thunkRva = (int32_t)(thunkRva);
    if (thunkRva == 0 || thunkRva == -1) return NULL;

    bufsize_t thunkValSize = this->getThunkValSize();
    offset_t offset = static_cast<offset_t>(this->entryNum) * thunkValSize;

    offset_t thunkAddr = m_Exe->toRaw(thunkRva + offset, Executable::RVA);
    void* thunkPtr = m_Exe->getContentAt(thunkAddr, thunkValSize);
    return thunkPtr;
}